

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O3

void __thiscall
duckdb::ListColumnReader::ListColumnReader
          (ListColumnReader *this,ParquetReader *reader,ParquetColumnSchema *schema,
          unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
          *child_column_reader_p)

{
  Allocator *allocator;
  data_ptr_t pdVar1;
  LogicalType *type_p;
  
  ColumnReader::ColumnReader(&this->super_ColumnReader,reader,schema);
  (this->super_ColumnReader)._vptr_ColumnReader = (_func_int **)&PTR__ListColumnReader_024859b8;
  (this->child_column_reader).
  super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
  super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl =
       (child_column_reader_p->
       super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
       super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
  (child_column_reader_p->
  super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
  super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)0x0;
  (this->child_defines).super_ByteBuffer.ptr = (data_ptr_t)0x0;
  (this->child_defines).super_ByteBuffer.len = 0;
  AllocatedData::AllocatedData(&(this->child_defines).allocated_data);
  (this->child_defines).alloc_len = 0;
  (this->child_repeats).super_ByteBuffer.ptr = (data_ptr_t)0x0;
  (this->child_repeats).super_ByteBuffer.len = 0;
  AllocatedData::AllocatedData(&(this->child_repeats).allocated_data);
  (this->child_repeats).alloc_len = 0;
  allocator = reader->allocator;
  type_p = ListType::GetChildType(&((this->super_ColumnReader).column_schema)->type);
  VectorCache::VectorCache(&this->read_cache,allocator,type_p,0x800);
  Vector::Vector(&this->read_vector,&this->read_cache);
  this->overflow_child_count = 0;
  ResizeableBuffer::resize(&this->child_defines,reader->allocator,0x800);
  ResizeableBuffer::resize(&this->child_repeats,reader->allocator,0x800);
  pdVar1 = (this->child_repeats).super_ByteBuffer.ptr;
  this->child_defines_ptr = (this->child_defines).super_ByteBuffer.ptr;
  this->child_repeats_ptr = pdVar1;
  return;
}

Assistant:

ListColumnReader::ListColumnReader(ParquetReader &reader, const ParquetColumnSchema &schema,
                                   unique_ptr<ColumnReader> child_column_reader_p)
    : ColumnReader(reader, schema), child_column_reader(std::move(child_column_reader_p)),
      read_cache(reader.allocator, ListType::GetChildType(Type())), read_vector(read_cache), overflow_child_count(0) {

	child_defines.resize(reader.allocator, STANDARD_VECTOR_SIZE);
	child_repeats.resize(reader.allocator, STANDARD_VECTOR_SIZE);
	child_defines_ptr = (uint8_t *)child_defines.ptr;
	child_repeats_ptr = (uint8_t *)child_repeats.ptr;
}